

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexay.cpp
# Opt level: O3

int __thiscall Lexay::getChar(Lexay *this)

{
  istream *piVar1;
  long lVar2;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (linelen <= linepos) {
    do {
      Basic::linenum = Basic::linenum + 1;
      piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)Basic::source,(string *)&currline_abi_cxx11_,'\n');
      if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) {
        lineflag = true;
        return -1;
      }
      linelen = (int)currline_abi_cxx11_._M_string_length;
      linepos = 0;
      lVar2 = std::__cxx11::string::find((char *)&currline_abi_cxx11_,0x10a5c4,0);
      if (lVar2 != -1) {
        std::__cxx11::string::substr((ulong)local_50,0x10d890);
        std::__cxx11::string::operator=((string *)&currline_abi_cxx11_,(string *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        linelen = (int)currline_abi_cxx11_._M_string_length;
      }
    } while (linelen <= linepos);
  }
  lVar2 = (long)linepos;
  linepos = linepos + 1;
  return (int)currline_abi_cxx11_._M_dataplus._M_p[lVar2];
}

Assistant:

int Lexay::getChar(){
	while(linepos >= linelen){
		linenum++;
		if(std::getline((*source), currline, '\n')){
			linelen = currline.size();
			linepos = 0;
			size_t pos = currline.find("//");
			if(pos != std::string::npos){
				currline = currline.substr(0, pos);
				linelen = currline.size();
			}
		}else{
			lineflag = true;
			return EOF;
		}
	}

	return currline[linepos++];
}